

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_deflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGCompressSettings *settings)

{
  uint *puVar1;
  uchar uVar2;
  int iVar3;
  size_t __size;
  size_t sVar4;
  uint *puVar5;
  uint *puVar6;
  uint *puVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int *__s;
  int *__s_00;
  unsigned_short *puVar11;
  unsigned_short *puVar12;
  int *__s_01;
  unsigned_short *puVar13;
  ulong uVar14;
  uchar *puVar15;
  uchar *puVar16;
  uint *puVar17;
  long lVar18;
  uint *puVar19;
  ulong uVar20;
  ulong uVar21;
  size_t sVar22;
  ulong uVar23;
  byte bVar24;
  ulong uVar25;
  size_t sVar26;
  size_t sVar27;
  int iVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  bool bVar34;
  bool bVar35;
  ucvector v;
  size_t bp;
  ulong local_1c0;
  ulong local_1b8;
  uchar *local_1b0;
  uivector bitlen_lld_e;
  uint *local_150;
  HuffmanTree tree_ll;
  uivector bitlen_lld;
  HuffmanTree tree_cl;
  HuffmanTree tree_d;
  uivector local_a8;
  uivector lz77_encoded;
  Hash local_68;
  ulong local_38;
  
  v.data = *out;
  v.size = *outsize;
  bp = 0;
  uVar29 = settings->btype;
  uVar8 = 0x3d;
  if (uVar29 < 3) {
    local_1c0 = insize;
    v.allocsize = v.size;
    local_1b0 = in;
    if (uVar29 != 1) {
      if (uVar29 == 0) {
        if (insize + 0xfffe < 0xffff) {
          uVar8 = 0;
        }
        else {
          uVar20 = (insize + 0xfffe) / 0xffff;
          uVar30 = 0;
          uVar29 = 0;
          do {
            sVar26 = v.size;
            uVar25 = v.size + 1;
            puVar15 = v.data;
            uVar14 = v.allocsize;
            if (v.allocsize < uVar25) {
              uVar14 = uVar25 * 3 >> 1;
              if (v.allocsize * 2 < uVar25) {
                uVar14 = uVar25;
              }
              puVar15 = (uchar *)realloc(v.data,uVar14);
              in = local_1b0;
              if (puVar15 != (uchar *)0x0) goto LAB_001a6404;
            }
            else {
LAB_001a6404:
              v.allocsize = uVar14;
              v.data = puVar15;
              v.data[sVar26] = uVar30 == uVar20 - 1;
              v.size = uVar25;
            }
            sVar26 = v.size;
            uVar14 = (ulong)uVar29;
            iVar3 = (int)insize - uVar29;
            if (0xfffe < insize - uVar14) {
              iVar3 = 0xffff;
            }
            uVar31 = v.size + 1;
            puVar15 = v.data;
            uVar25 = v.allocsize;
            if (v.allocsize < uVar31) {
              uVar25 = uVar31 * 3 >> 1;
              if (v.allocsize * 2 < uVar31) {
                uVar25 = uVar31;
              }
              puVar15 = (uchar *)realloc(v.data,uVar25);
              in = local_1b0;
              if (puVar15 != (uchar *)0x0) goto LAB_001a6480;
            }
            else {
LAB_001a6480:
              v.allocsize = uVar25;
              v.data = puVar15;
              v.data[sVar26] = (uchar)iVar3;
              v.size = uVar31;
            }
            sVar26 = v.size;
            uVar31 = v.size + 1;
            puVar15 = v.data;
            uVar25 = v.allocsize;
            if (v.allocsize < uVar31) {
              uVar25 = uVar31 * 3 >> 1;
              if (v.allocsize * 2 < uVar31) {
                uVar25 = uVar31;
              }
              puVar15 = (uchar *)realloc(v.data,uVar25);
              in = local_1b0;
              if (puVar15 != (uchar *)0x0) goto LAB_001a64dc;
            }
            else {
LAB_001a64dc:
              v.allocsize = uVar25;
              v.data = puVar15;
              v.data[sVar26] = (uchar)((uint)iVar3 >> 8);
              v.size = uVar31;
            }
            sVar26 = v.size;
            uVar31 = v.size + 1;
            puVar15 = v.data;
            uVar25 = v.allocsize;
            if (v.allocsize < uVar31) {
              uVar25 = uVar31 * 3 >> 1;
              if (v.allocsize * 2 < uVar31) {
                uVar25 = uVar31;
              }
              puVar15 = (uchar *)realloc(v.data,uVar25);
              in = local_1b0;
              if (puVar15 != (uchar *)0x0) goto LAB_001a653b;
            }
            else {
LAB_001a653b:
              v.allocsize = uVar25;
              v.data = puVar15;
              v.data[sVar26] = (uchar)(0xffff - iVar3);
              v.size = uVar31;
            }
            sVar26 = v.size;
            uVar31 = v.size + 1;
            puVar15 = v.data;
            uVar25 = v.allocsize;
            if (v.allocsize < uVar31) {
              uVar25 = uVar31 * 3 >> 1;
              if (v.allocsize * 2 < uVar31) {
                uVar25 = uVar31;
              }
              puVar15 = (uchar *)realloc(v.data,uVar25);
              in = local_1b0;
              if (puVar15 != (uchar *)0x0) goto LAB_001a6593;
            }
            else {
LAB_001a6593:
              v.allocsize = uVar25;
              v.data = puVar15;
              v.data[sVar26] = (uchar)((uint)(0xffff - iVar3) >> 8);
              v.size = uVar31;
            }
            if (uVar14 < insize) {
              uVar25 = 0;
              do {
                sVar26 = v.size;
                uVar2 = in[uVar14];
                uVar31 = v.size + 1;
                puVar15 = v.data;
                uVar14 = v.allocsize;
                if (v.allocsize < uVar31) {
                  uVar14 = uVar31 * 3 >> 1;
                  if (v.allocsize * 2 < uVar31) {
                    uVar14 = uVar31;
                  }
                  puVar15 = (uchar *)realloc(v.data,uVar14);
                  in = local_1b0;
                  if (puVar15 != (uchar *)0x0) goto LAB_001a65f9;
                }
                else {
LAB_001a65f9:
                  v.allocsize = uVar14;
                  v.data = puVar15;
                  v.data[sVar26] = uVar2;
                  v.size = uVar31;
                }
                uVar31 = uVar25 + 1;
              } while ((uVar25 < 0xfffe) &&
                      (uVar14 = (ulong)(uVar29 + (int)uVar25 + 1), uVar25 = uVar31, uVar14 < insize)
                      );
              uVar29 = uVar29 + (int)uVar31;
            }
            uVar30 = uVar30 + 1;
          } while (uVar30 != uVar20);
          uVar8 = 0;
        }
        goto LAB_001a766d;
      }
      uVar20 = 0xfff8;
      if (0xfff8 < insize >> 3) {
        uVar20 = insize >> 3;
      }
      if (0x3fff7 < uVar20) {
        uVar20 = 0x3fff8;
      }
      local_1c0 = uVar20 + 8;
    }
    uVar20 = 1;
    if (!CARRY8(insize - 1,local_1c0)) {
      uVar20 = ((insize - 1) + local_1c0) / local_1c0;
    }
    uVar30 = (ulong)settings->windowsize;
    __s = (int *)malloc(0x40000);
    local_68.head = __s;
    __s_00 = (int *)malloc(uVar30 * 4);
    __size = uVar30 * 2;
    local_68.val = __s_00;
    puVar11 = (unsigned_short *)malloc(__size);
    local_68.chain = puVar11;
    puVar12 = (unsigned_short *)malloc(__size);
    local_68.zeros = puVar12;
    __s_01 = (int *)malloc(0x40c);
    local_68.headz = __s_01;
    puVar13 = (unsigned_short *)malloc(__size);
    uVar8 = 0x53;
    local_68.chainz = puVar13;
    if (__s_00 == (int *)0x0) {
      bVar35 = false;
    }
    else if (((__s == (int *)0x0) || (puVar11 == (unsigned_short *)0x0)) ||
            (bVar35 = false, puVar12 == (unsigned_short *)0x0)) {
      bVar35 = false;
    }
    else if ((__s_01 != (int *)0x0) && (puVar13 != (unsigned_short *)0x0)) {
      memset(__s,0xff,0x40000);
      if (uVar30 == 0) {
        memset(__s_01,0xff,0x40c);
      }
      else {
        memset(__s_00,0xff,uVar30 * 4);
        uVar14 = 0;
        do {
          puVar11[uVar14] = (unsigned_short)uVar14;
          uVar14 = uVar14 + 1;
        } while (uVar30 != uVar14);
        memset(__s_01,0xff,0x40c);
        uVar14 = 0;
        do {
          puVar13[uVar14] = (unsigned_short)uVar14;
          uVar14 = uVar14 + 1;
        } while (uVar30 != uVar14);
      }
      uVar8 = 0;
      bVar35 = true;
    }
    if (bVar35) {
      if (uVar20 == 0) {
        uVar8 = 0;
      }
      else {
        lVar18 = 0;
        uVar8 = 0;
        uVar25 = 0;
        puVar15 = local_1b0;
        uVar14 = local_1c0;
        uVar30 = local_1c0;
        do {
          uVar31 = uVar14;
          if (insize < uVar14) {
            uVar31 = insize;
          }
          bVar35 = uVar25 == uVar20 - 1;
          sVar26 = uVar25 * uVar30;
          uVar33 = sVar26 + uVar30;
          if (insize <= sVar26 + uVar30) {
            uVar33 = insize;
          }
          if (settings->btype == 2) {
            lz77_encoded.data = (uint *)0x0;
            lz77_encoded.size = 0;
            lz77_encoded.allocsize = 0;
            tree_ll.tree2d = (uint *)0x0;
            tree_ll.tree1d = (uint *)0x0;
            tree_ll.lengths = (uint *)0x0;
            tree_d.tree2d = (uint *)0x0;
            tree_d.tree1d = (uint *)0x0;
            tree_d.lengths = (uint *)0x0;
            tree_cl.tree2d = (uint *)0x0;
            tree_cl.tree1d = (uint *)0x0;
            tree_cl.lengths = (uint *)0x0;
            bitlen_lld.data = (uint *)0x0;
            bitlen_lld.size = 0;
            bitlen_lld.allocsize = 0;
            bitlen_lld_e.data = (uint *)0x0;
            bitlen_lld_e.size = 0;
            bitlen_lld_e.allocsize = 0;
            local_a8.data = (uint *)0x0;
            local_a8.size = 0;
            local_a8.allocsize = 0;
            if (settings->use_lz77 == 0) {
              uVar29 = uivector_resize(&lz77_encoded,uVar33 - sVar26);
              if (uVar29 != 0) {
                if (sVar26 < uVar33) {
                  do {
                    lz77_encoded.data[sVar26] = (uint)local_1b0[sVar26];
                    sVar26 = sVar26 + 1;
                  } while (uVar31 != sVar26);
                }
                goto LAB_001a6b0c;
              }
              uVar8 = 0x53;
LAB_001a6cdf:
              puVar17 = (uint *)0x0;
              local_150 = (uint *)0x0;
LAB_001a6cf6:
              puVar19 = (uint *)0x0;
            }
            else {
              uVar8 = encodeLZ77(&lz77_encoded,&local_68,local_1b0,sVar26,uVar33,
                                 settings->windowsize,settings->minmatch,settings->nicematch,
                                 settings->lazymatching);
              if (uVar8 != 0) goto LAB_001a6cdf;
LAB_001a6b0c:
              local_1b8 = uVar14;
              puVar17 = (uint *)malloc(0x478);
              uVar29 = 0x53;
              if (puVar17 == (uint *)0x0) {
                local_150 = (uint *)0x0;
              }
              else {
                memset(puVar17,0,0x478);
                local_150 = (uint *)malloc(0x78);
                if (local_150 != (uint *)0x0) {
                  local_150[0x18] = 0;
                  local_150[0x19] = 0;
                  local_150[0x1a] = 0;
                  local_150[0x1b] = 0;
                  local_150[0x14] = 0;
                  local_150[0x15] = 0;
                  local_150[0x16] = 0;
                  local_150[0x17] = 0;
                  local_150[0x10] = 0;
                  local_150[0x11] = 0;
                  local_150[0x12] = 0;
                  local_150[0x13] = 0;
                  local_150[0xc] = 0;
                  local_150[0xd] = 0;
                  local_150[0xe] = 0;
                  local_150[0xf] = 0;
                  local_150[8] = 0;
                  local_150[9] = 0;
                  local_150[10] = 0;
                  local_150[0xb] = 0;
                  local_150[4] = 0;
                  local_150[5] = 0;
                  local_150[6] = 0;
                  local_150[7] = 0;
                  local_150[0] = 0;
                  local_150[1] = 0;
                  local_150[2] = 0;
                  local_150[3] = 0;
                  local_150[0x1c] = 0;
                  local_150[0x1d] = 0;
                  if (lz77_encoded.size != 0) {
                    sVar26 = 0;
                    do {
                      uVar8 = lz77_encoded.data[sVar26];
                      puVar17[uVar8] = puVar17[uVar8] + 1;
                      if (0x100 < (ulong)uVar8) {
                        local_150[lz77_encoded.data[sVar26 + 2]] =
                             local_150[lz77_encoded.data[sVar26 + 2]] + 1;
                        sVar26 = sVar26 + 3;
                      }
                      sVar26 = sVar26 + 1;
                    } while (sVar26 != lz77_encoded.size);
                  }
                  puVar17[0x100] = 1;
                  uVar8 = HuffmanTree_makeFromFrequencies(&tree_ll,puVar17,0x101,0x11e,0xf);
                  if (uVar8 == 0) {
                    uVar8 = HuffmanTree_makeFromFrequencies(&tree_d,local_150,2,0x1e,0xf);
                    uVar10 = tree_d.numcodes;
                    puVar19 = tree_ll.lengths;
                    uVar14 = local_1b8;
                    if (uVar8 != 0) goto LAB_001a6cf6;
                    uVar30 = 0x11e;
                    if (tree_ll.numcodes < 0x11e) {
                      uVar30 = (ulong)tree_ll.numcodes;
                    }
                    uVar31 = 0x1e;
                    if (tree_d.numcodes < 0x1e) {
                      uVar31 = (ulong)tree_d.numcodes;
                    }
                    if (tree_ll.numcodes != 0) {
                      uVar14 = 0;
                      do {
                        uVar8 = puVar19[uVar14];
                        uVar9 = uivector_resize(&bitlen_lld,bitlen_lld.size + 1);
                        if (uVar9 != 0) {
                          bitlen_lld.data[bitlen_lld.size - 1] = uVar8;
                        }
                        uVar14 = uVar14 + 1;
                      } while (uVar30 != uVar14);
                    }
                    puVar19 = tree_d.lengths;
                    if (uVar10 != 0) {
                      uVar14 = 0;
                      do {
                        uVar8 = puVar19[uVar14];
                        uVar10 = uivector_resize(&bitlen_lld,bitlen_lld.size + 1);
                        if (uVar10 != 0) {
                          bitlen_lld.data[bitlen_lld.size - 1] = uVar8;
                        }
                        uVar14 = uVar14 + 1;
                      } while (uVar31 != uVar14);
                    }
                    puVar19 = bitlen_lld.data;
                    uVar14 = bitlen_lld.size & 0xffffffff;
                    local_38 = uVar30;
                    if (uVar14 != 0) {
                      uVar30 = 0;
                      do {
                        uVar33 = uVar30 + 1;
                        uVar23 = 0;
                        if (uVar33 < uVar14) {
                          uVar23 = 0;
                          uVar21 = uVar33;
                          do {
                            if (puVar19[uVar21] != puVar19[uVar30]) break;
                            uVar23 = (ulong)((int)uVar23 + 1);
                            uVar21 = uVar33 + uVar23;
                          } while (uVar21 < uVar14);
                        }
                        uVar8 = puVar19[uVar30];
                        uVar10 = (uint)uVar23;
                        if ((uVar10 < 2) || (uVar8 != 0)) {
                          if (2 < uVar10) {
                            uVar9 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                            if (uVar9 != 0) {
                              bitlen_lld_e.data[bitlen_lld_e.size - 1] = uVar8;
                            }
                            uVar33 = uVar23 / 6;
                            if (5 < uVar10) {
                              do {
                                uVar8 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                                if (uVar8 != 0) {
                                  bitlen_lld_e.data[bitlen_lld_e.size - 1] = 0x10;
                                }
                                uVar8 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                                if (uVar8 != 0) {
                                  bitlen_lld_e.data[bitlen_lld_e.size - 1] = 3;
                                }
                                uVar33 = uVar33 - 1;
                              } while (uVar33 != 0);
                            }
                            uVar8 = uVar10 + (int)(uVar23 / 6) * -6;
                            if (uVar8 < 3) {
                              uVar23 = (ulong)(uVar10 - uVar8);
                            }
                            else {
                              uVar10 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                              if (uVar10 != 0) {
                                bitlen_lld_e.data[bitlen_lld_e.size - 1] = 0x10;
                              }
                              uVar10 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                              if (uVar10 != 0) {
                                bitlen_lld_e.data[bitlen_lld_e.size - 1] = uVar8 - 3;
                              }
                            }
                            goto LAB_001a71d8;
                          }
                          uVar10 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                          if (uVar10 != 0) {
                            bitlen_lld_e.data[bitlen_lld_e.size - 1] = uVar8;
                          }
                        }
                        else {
                          uVar8 = uVar10 + 1;
                          if (uVar8 < 0xb) {
                            uVar8 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                            if (uVar8 != 0) {
                              bitlen_lld_e.data[bitlen_lld_e.size - 1] = 0x11;
                            }
                            uVar8 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                            if (uVar8 != 0) {
                              bitlen_lld_e.data[bitlen_lld_e.size - 1] = uVar10 - 2;
                            }
                          }
                          else {
                            if (0x89 < uVar8) {
                              uVar8 = 0x8a;
                            }
                            uVar10 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                            if (uVar10 != 0) {
                              bitlen_lld_e.data[bitlen_lld_e.size - 1] = 0x12;
                            }
                            uVar10 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                            if (uVar10 != 0) {
                              bitlen_lld_e.data[bitlen_lld_e.size - 1] = uVar8 - 0xb;
                            }
                            uVar23 = (ulong)(uVar8 - 1);
                          }
LAB_001a71d8:
                          uVar30 = uVar30 + uVar23;
                        }
                        uVar30 = uVar30 + 1;
                      } while (uVar30 != uVar14);
                    }
                    uVar30 = local_1c0;
                    puVar19 = (uint *)malloc(0x4c);
                    sVar26 = bitlen_lld_e.size;
                    uVar14 = local_1b8;
                    uVar8 = uVar29;
                    if (puVar19 != (uint *)0x0) {
                      puVar19[0xf] = 0;
                      puVar19[0x10] = 0;
                      puVar19[0x11] = 0;
                      puVar19[0x12] = 0;
                      puVar19[0xc] = 0;
                      puVar19[0xd] = 0;
                      puVar19[0xe] = 0;
                      puVar19[0xf] = 0;
                      puVar19[8] = 0;
                      puVar19[9] = 0;
                      puVar19[10] = 0;
                      puVar19[0xb] = 0;
                      puVar19[4] = 0;
                      puVar19[5] = 0;
                      puVar19[6] = 0;
                      puVar19[7] = 0;
                      puVar19[0] = 0;
                      puVar19[1] = 0;
                      puVar19[2] = 0;
                      puVar19[3] = 0;
                      if (bitlen_lld_e.size != 0) {
                        sVar22 = 0;
                        do {
                          uVar8 = bitlen_lld_e.data[sVar22];
                          puVar19[uVar8] = puVar19[uVar8] + 1;
                          sVar22 = (sVar22 - ((ulong)uVar8 < 0x10)) + 2;
                        } while (sVar22 != bitlen_lld_e.size);
                      }
                      uVar8 = HuffmanTree_makeFromFrequencies(&tree_cl,puVar19,0x13,0x13,7);
                      uVar14 = local_1b8;
                      if (uVar8 == 0) {
                        uVar33 = (ulong)tree_cl.numcodes;
                        uVar10 = uivector_resize(&local_a8,uVar33);
                        uVar14 = local_1b8;
                        uVar8 = uVar29;
                        if (uVar10 != 0) {
                          if (uVar33 != 0) {
                            lVar32 = 0;
                            do {
                              *(uint *)((long)local_a8.data + lVar32) =
                                   tree_cl.lengths[*(uint *)((long)CLCL_ORDER + lVar32)];
                              lVar32 = lVar32 + 4;
                            } while (uVar33 << 2 != lVar32);
                          }
                          do {
                            uVar29 = local_a8.data[local_a8.size - 1];
                            bVar34 = local_a8.size < 5;
                            if (bVar34 || uVar29 != 0) {
                              uVar8 = 0;
                              goto LAB_001a7332;
                            }
                            uVar8 = uivector_resize(&local_a8,local_a8.size - 1);
                          } while (uVar8 != 0);
                          uVar8 = 0x53;
LAB_001a7332:
                          sVar4 = bp;
                          sVar22 = v.size;
                          uVar14 = local_1b8;
                          if (bVar34 || uVar29 != 0) {
                            if ((bp & 7) == 0) {
                              sVar27 = v.size + 1;
                              uVar29 = ucvector_reserve(&v,sVar27);
                              if (uVar29 != 0) {
                                v.data[sVar22] = '\0';
                                v.size = sVar27;
                              }
                            }
                            sVar22 = v.size;
                            v.data[v.size - 1] = v.data[v.size - 1] | bVar35 << ((byte)sVar4 & 7);
                            bp = sVar4 + 1;
                            if ((bp & 7) == 0) {
                              sVar27 = v.size + 1;
                              uVar29 = ucvector_reserve(&v,sVar27);
                              if (uVar29 != 0) {
                                v.data[sVar22] = '\0';
                                v.size = sVar27;
                              }
                            }
                            sVar22 = v.size;
                            bp = sVar4 + 2;
                            bVar24 = (byte)bp;
                            if ((bp & 7) == 0) {
                              sVar27 = v.size + 1;
                              uVar29 = ucvector_reserve(&v,sVar27);
                              if (uVar29 != 0) {
                                v.data[sVar22] = '\0';
                                v.size = sVar27;
                              }
                            }
                            puVar5 = local_a8.data;
                            v.data[v.size - 1] = v.data[v.size - 1] | '\x01' << (bVar24 & 7);
                            bp = sVar4 + 3;
                            iVar3 = (int)local_a8.size;
                            uVar14 = (ulong)(iVar3 - 4) + 3;
                            uVar30 = 0;
                            do {
                              uVar33 = uVar30;
                              if (uVar33 == iVar3 - 4) break;
                              uVar23 = uVar14 & 0xffffffff;
                              uVar14 = uVar14 - 1;
                              uVar30 = uVar33 + 1;
                            } while (local_a8.data[uVar23] == 0);
                            iVar28 = (int)(uVar33 + 1);
                            addBitsToStream(&bp,&v,(int)local_38 - 0x101,5);
                            addBitsToStream(&bp,&v,(int)uVar31 - 1,5);
                            addBitsToStream(&bp,&v,(iVar3 - iVar28) - 3,4);
                            if (iVar3 + 1 != iVar28) {
                              uVar30 = 0;
                              do {
                                addBitsToStream(&bp,&v,puVar5[uVar30],3);
                                uVar30 = uVar30 + 1;
                              } while ((uint)(iVar3 - (int)uVar33) != uVar30);
                            }
                            puVar7 = tree_cl.lengths;
                            puVar6 = tree_cl.tree1d;
                            puVar5 = bitlen_lld_e.data;
                            if (sVar26 != 0) {
                              sVar22 = 0;
                              do {
                                addHuffmanSymbol(&bp,&v,puVar6[puVar5[sVar22]],
                                                 puVar7[puVar5[sVar22]]);
                                puVar1 = puVar5 + sVar22;
                                if (*puVar1 - 0x10 < 3) {
                                  lVar32 = sVar22 + 1;
                                  sVar22 = sVar22 + 1;
                                  addBitsToStream(&bp,&v,puVar5[lVar32],
                                                  *(size_t *)
                                                   (&DAT_00238e70 + (ulong)(*puVar1 - 0x10) * 8));
                                }
                                sVar22 = sVar22 + 1;
                              } while (sVar22 != sVar26);
                            }
                            writeLZ77data(&bp,&v,&lz77_encoded,&tree_ll,&tree_d);
                            if (tree_ll.lengths[0x100] == 0) {
                              uVar14 = local_1b8;
                              uVar30 = local_1c0;
                              uVar8 = 0x40;
                            }
                            else {
                              addHuffmanSymbol(&bp,&v,tree_ll.tree1d[0x100],tree_ll.lengths[0x100]);
                              uVar14 = local_1b8;
                              uVar30 = local_1c0;
                              uVar8 = 0;
                            }
                          }
                        }
                      }
                    }
                  }
                  else {
                    puVar19 = (uint *)0x0;
                    uVar14 = local_1b8;
                  }
                  goto LAB_001a6cf9;
                }
              }
              puVar19 = (uint *)0x0;
              uVar14 = local_1b8;
              uVar8 = uVar29;
            }
LAB_001a6cf9:
            lz77_encoded.size = 0;
            lz77_encoded.allocsize = 0;
            free(lz77_encoded.data);
            lz77_encoded.data = (uint *)0x0;
            free(tree_ll.tree2d);
            free(tree_ll.tree1d);
            free(tree_ll.lengths);
            free(tree_d.tree2d);
            free(tree_d.tree1d);
            free(tree_d.lengths);
            free(tree_cl.tree2d);
            free(tree_cl.tree1d);
            free(tree_cl.lengths);
            free(puVar17);
            free(local_150);
            free(puVar19);
            bitlen_lld_e.size = 0;
            bitlen_lld_e.allocsize = 0;
            free(bitlen_lld_e.data);
            bitlen_lld_e.data = (uint *)0x0;
            bitlen_lld.size = 0;
            bitlen_lld.allocsize = 0;
            free(bitlen_lld.data);
            bitlen_lld.data = (uint *)0x0;
            local_a8.size = 0;
            local_a8.allocsize = 0;
            free(local_a8.data);
          }
          else if (settings->btype == 1) {
            tree_ll.tree2d = (uint *)0x0;
            tree_ll.tree1d = (uint *)0x0;
            tree_ll.lengths = (uint *)0x0;
            tree_d.tree2d = (uint *)0x0;
            tree_d.tree1d = (uint *)0x0;
            tree_d.lengths = (uint *)0x0;
            local_1b8 = uVar14;
            generateFixedLitLenTree(&tree_ll);
            generateFixedDistanceTree(&tree_d);
            sVar4 = bp;
            sVar22 = v.size;
            if ((bp & 7) == 0) {
              uVar14 = v.size + 1;
              puVar16 = v.data;
              uVar30 = v.allocsize;
              if (v.allocsize < uVar14) {
                uVar30 = uVar14 * 3 >> 1;
                if (v.allocsize * 2 < uVar14) {
                  uVar30 = uVar14;
                }
                puVar16 = (uchar *)realloc(v.data,uVar30);
                if (puVar16 == (uchar *)0x0) goto LAB_001a67c4;
              }
              v.allocsize = uVar30;
              v.data = puVar16;
              v.data[sVar22] = '\0';
              v.size = uVar14;
            }
LAB_001a67c4:
            sVar22 = v.size;
            v.data[v.size - 1] = v.data[v.size - 1] | bVar35 << ((byte)sVar4 & 7);
            bp = sVar4 + 1;
            bVar24 = (byte)bp;
            if ((bp & 7) == 0) {
              uVar14 = v.size + 1;
              puVar16 = v.data;
              uVar30 = v.allocsize;
              if (v.allocsize < uVar14) {
                uVar30 = uVar14 * 3 >> 1;
                if (v.allocsize * 2 < uVar14) {
                  uVar30 = uVar14;
                }
                puVar16 = (uchar *)realloc(v.data,uVar30);
                if (puVar16 == (uchar *)0x0) goto LAB_001a684a;
              }
              v.allocsize = uVar30;
              v.data = puVar16;
              v.data[sVar22] = '\0';
              v.size = uVar14;
            }
LAB_001a684a:
            sVar22 = v.size;
            v.data[v.size - 1] = v.data[v.size - 1] | '\x01' << (bVar24 & 7);
            bp = sVar4 + 2;
            if ((bp & 7) == 0) {
              uVar14 = v.size + 1;
              puVar16 = v.data;
              uVar30 = v.allocsize;
              if (v.allocsize < uVar14) {
                uVar30 = uVar14 * 3 >> 1;
                if (v.allocsize * 2 < uVar14) {
                  uVar30 = uVar14;
                }
                puVar16 = (uchar *)realloc(v.data,uVar30);
                if (puVar16 == (uchar *)0x0) goto LAB_001a68c9;
              }
              v.allocsize = uVar30;
              v.data = puVar16;
              v.data[sVar22] = '\0';
              v.size = uVar14;
            }
LAB_001a68c9:
            puVar19 = tree_ll.lengths;
            puVar17 = tree_ll.tree1d;
            bp = sVar4 + 3;
            if (settings->use_lz77 == 0) {
              uVar8 = 0;
              uVar14 = local_1b8;
              uVar30 = local_1c0;
              if (sVar26 < uVar33) {
                lVar32 = 0;
                do {
                  addHuffmanSymbol(&bp,&v,puVar17[puVar15[lVar32]],puVar19[puVar15[lVar32]]);
                  lVar32 = lVar32 + 1;
                } while (uVar31 + lVar18 != lVar32);
                uVar8 = 0;
                uVar14 = local_1b8;
                uVar30 = local_1c0;
              }
            }
            else {
              tree_cl.tree2d = (uint *)0x0;
              tree_cl.tree1d = (uint *)0x0;
              tree_cl.lengths = (uint *)0x0;
              uVar8 = encodeLZ77((uivector *)&tree_cl,&local_68,local_1b0,sVar26,uVar33,
                                 settings->windowsize,settings->minmatch,settings->nicematch,
                                 settings->lazymatching);
              uVar14 = local_1b8;
              uVar30 = local_1c0;
              if (uVar8 == 0) {
                writeLZ77data(&bp,&v,(uivector *)&tree_cl,&tree_ll,&tree_d);
              }
              tree_cl.tree1d = (uint *)0x0;
              tree_cl.lengths = (uint *)0x0;
              free(tree_cl.tree2d);
            }
            if (uVar8 == 0) {
              addHuffmanSymbol(&bp,&v,tree_ll.tree1d[0x100],tree_ll.lengths[0x100]);
            }
            free(tree_ll.tree2d);
            free(tree_ll.tree1d);
            free(tree_ll.lengths);
            free(tree_d.tree2d);
            free(tree_d.tree1d);
            free(tree_d.lengths);
          }
          uVar25 = uVar25 + 1;
          if (uVar25 == uVar20) break;
          uVar14 = uVar14 + uVar30;
          lVar18 = lVar18 - uVar30;
          puVar15 = puVar15 + uVar30;
        } while (uVar8 == 0);
      }
      free(local_68.head);
      free(local_68.val);
      free(local_68.chain);
      free(local_68.zeros);
      free(local_68.headz);
      free(local_68.chainz);
    }
  }
LAB_001a766d:
  *out = v.data;
  *outsize = v.size;
  return uVar8;
}

Assistant:

unsigned lodepng_deflate(unsigned char** out, size_t* outsize,
                         const unsigned char* in, size_t insize,
                         const LodePNGCompressSettings* settings)
{
  unsigned error;
  ucvector v;
  ucvector_init_buffer(&v, *out, *outsize);
  error = lodepng_deflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}